

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_Init(parsercontext *p)

{
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  char *local_90;
  ebml_semantic *local_88;
  ebml_semantic *local_80;
  bool_t local_78;
  bool_t local_70;
  ebml_context *local_68;
  int local_60;
  undefined4 uStack_5c;
  bool_t local_58;
  bool_t local_50;
  ebml_context *local_48;
  undefined4 local_40;
  uint uStack_3c;
  bool_t local_38;
  bool_t local_30;
  ebml_context *local_28;
  undefined4 local_20;
  uint uStack_1c;
  err_t local_18;
  err_t Err;
  parsercontext *p_local;
  
  Err = (err_t)p;
  local_18 = EBML_Init(p);
  if (local_18 == 0) {
    NodeRegisterClassEx((nodemodule *)Err,Matroska_Class);
    if (Err == 0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x28,"err_t MATROSKA_Init(parsercontext *)");
    }
    (**(code **)(*(long *)(Err + 8) + 0x40))(Err,0x402,4,"libmatroska2 v0.22.3");
    if (MATROSKA_init_once == 0) {
      MATROSKA_init_once = 1;
      MATROSKA_InitSemantic();
      local_38 = 1;
      local_30 = 0;
      EBML_SemanticMatroska[0].eClass = EBML_getContextHead();
      local_20 = 0;
      EBML_SemanticMatroska[0].Mandatory = local_38;
      EBML_SemanticMatroska[0].Unique = local_30;
      EBML_SemanticMatroska[0]._24_8_ = (ulong)uStack_1c << 0x20;
      local_58 = 1;
      local_50 = 0;
      local_28 = EBML_SemanticMatroska[0].eClass;
      EBML_SemanticMatroska[1].eClass = MATROSKA_getContextSegment();
      local_40 = 0;
      EBML_SemanticMatroska[1].Mandatory = local_58;
      EBML_SemanticMatroska[1].Unique = local_50;
      EBML_SemanticMatroska[1]._24_8_ = (ulong)uStack_3c << 0x20;
      local_48 = EBML_SemanticMatroska[1].eClass;
      memset(&local_78,0,0x20);
      EBML_SemanticMatroska[2].Mandatory = local_78;
      EBML_SemanticMatroska[2].Unique = local_70;
      EBML_SemanticMatroska[2].eClass = local_68;
      EBML_SemanticMatroska[2].DisabledProfile = local_60;
      EBML_SemanticMatroska[2]._28_4_ = uStack_5c;
      local_a8 = 0x5f584b4d;
      local_a4 = 0x544d4245;
      local_a0 = 0;
      local_98 = 0;
      local_90 = "Matroska Stream";
      local_88 = EBML_SemanticMatroska;
      local_80 = EBML_getSemanticGlobals();
      memcpy(&MATROSKA_ContextStream,&local_a8,0x30);
    }
  }
  return local_18;
}

Assistant:

err_t MATROSKA_Init(parsercontext *p)
{
    err_t Err = EBML_Init(p);
    if (Err == ERR_NONE)
    {
        NodeRegisterClassEx(&p->Base.Base,Matroska_Class);

        Node_SetData(p,CONTEXT_LIBMATROSKA_VERSION,TYPE_STRING,T("libmatroska2 v") LIBMATROSKA2_PROJECT_VERSION);

        // TODO fix race condition
        if (!MATROSKA_init_once)
        {
            MATROSKA_init_once = 1;

            MATROSKA_InitSemantic();

            EBML_SemanticMatroska[0] = (ebml_semantic){1, 0, EBML_getContextHead()        ,0};
            EBML_SemanticMatroska[1] = (ebml_semantic){1, 0, MATROSKA_getContextSegment() ,0};
            EBML_SemanticMatroska[2] = (ebml_semantic){0, 0, NULL                         ,0}; // end of the table
            MATROSKA_ContextStream = (ebml_context){FOURCC('M','K','X','_'), EBML_MASTER_CLASS, 0, 0, "Matroska Stream", EBML_SemanticMatroska, EBML_getSemanticGlobals()};
        }
    }
    return Err;
}